

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O0

void __thiscall
kj::
NoInfer_<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++:76:50)>
::Type::operator()(void *this)

{
  undefined4 *puVar1;
  Type *this_local;
  
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 0x7b;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

TEST(Exception, RunCatchingExceptionsOtherException) {
  Maybe<Exception> e = kj::runCatchingExceptions([&]() {
    throw 123;
  });

  KJ_IF_MAYBE(ex, e) {
#if __GNUC__ && !KJ_NO_RTTI
    EXPECT_EQ("unknown non-KJ exception of type: int", ex->getDescription());
#else
    EXPECT_EQ("unknown non-KJ exception", ex->getDescription());
#endif
  } else {
    ADD_FAILURE() << "Expected exception";
  }
}